

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O2

int gost_pkey_asn1_meths(ENGINE *e,EVP_PKEY_ASN1_METHOD **ameth,int **nids,int nid)

{
  int iVar1;
  EVP_PKEY_ASN1_METHOD ***pppEVar2;
  
  if (ameth == (EVP_PKEY_ASN1_METHOD **)0x0) {
    gost_meth_nids(nids);
    iVar1 = 10;
  }
  else {
    for (pppEVar2 = &gost_meth_array[0].ameth; ((gost_meth_minfo *)(pppEVar2 + -2))->nid != 0;
        pppEVar2 = pppEVar2 + 5) {
      if (((gost_meth_minfo *)(pppEVar2 + -2))->nid == nid) {
        *ameth = **pppEVar2;
        return 1;
      }
    }
    *ameth = (EVP_PKEY_ASN1_METHOD *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int gost_pkey_asn1_meths(ENGINE *e, EVP_PKEY_ASN1_METHOD **ameth,
                                const int **nids, int nid)
{
    struct gost_meth_minfo *info;

    if (!ameth)
        return gost_meth_nids(nids);

    for (info = gost_meth_array; info->nid; info++)
        if (nid == info->nid) {
            *ameth = *info->ameth;
            return 1;
        }
    *ameth = NULL;
    return 0;
}